

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLFormulasLoader.cpp
# Opt level: O0

INode * __thiscall
COLLADASaxFWL::FormulasLoader::createUnaryOperation
          (FormulasLoader *this,NodeVector *nodes,Operator op)

{
  UnaryExpression *this_00;
  const_reference ppIVar1;
  int in_EDX;
  vector<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_> *in_RSI;
  UnaryExpression *expression;
  Operator mmlOp;
  uint local_20;
  
  if (in_EDX == 0) {
    local_20 = 0;
  }
  else if (in_EDX == 1) {
    local_20 = 1;
  }
  else {
    if (in_EDX != 4) {
      return (INode *)0x0;
    }
    local_20 = 2;
  }
  this_00 = (UnaryExpression *)operator_new(0x18);
  MathML::AST::UnaryExpression::UnaryExpression(this_00);
  (*(this_00->super_INode)._vptr_INode[6])(this_00,(ulong)local_20);
  ppIVar1 = std::vector<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>::operator[]
                      (in_RSI,0);
  (*(this_00->super_INode)._vptr_INode[10])(this_00,*ppIVar1);
  return &this_00->super_INode;
}

Assistant:

MathML::AST::INode* FormulasLoader::createUnaryOperation( const NodeVector& nodes, Operator op )
	{
		MathML::AST::UnaryExpression::Operator mmlOp;
		switch ( op )
		{
		case ADD:
			mmlOp = MathML::AST::UnaryExpression::ADD;
			break;
		case SUB:
			mmlOp = MathML::AST::UnaryExpression::SUB;
			break;
		case NOT:
			mmlOp = MathML::AST::UnaryExpression::NOT;
			break;
		default:
			// invalid operator
			return 0;
		}

		MathML::AST::UnaryExpression* expression = new MathML::AST::UnaryExpression();
		expression->setOperator( mmlOp );
		expression->setOperand( nodes[ 0 ] );

		return expression;
	}